

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O3

string * cmQtAutoGen::GeneratorNameUpper_abi_cxx11_(GenT genType)

{
  int iVar1;
  string *psVar2;
  
  if (GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOGEN_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::
                                 AUTOGEN_abi_cxx11_);
    if (iVar1 != 0) {
      GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOGEN_abi_cxx11_._M_dataplus._M_p =
           (pointer)&GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOGEN_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOGEN_abi_cxx11_,
                 "AUTOGEN","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOGEN_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOGEN_abi_cxx11_);
    }
  }
  if (GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOMOC_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::
                                 AUTOMOC_abi_cxx11_);
    if (iVar1 != 0) {
      GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOMOC_abi_cxx11_._M_dataplus._M_p =
           (pointer)&GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOMOC_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOMOC_abi_cxx11_,
                 "AUTOMOC","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOMOC_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOMOC_abi_cxx11_);
    }
  }
  if (GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOUIC_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::
                                 AUTOUIC_abi_cxx11_);
    if (iVar1 != 0) {
      GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOUIC_abi_cxx11_._M_dataplus._M_p =
           (pointer)&GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOUIC_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOUIC_abi_cxx11_,
                 "AUTOUIC","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOUIC_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOUIC_abi_cxx11_);
    }
  }
  if (GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTORCC_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::
                                 AUTORCC_abi_cxx11_);
    if (iVar1 != 0) {
      GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTORCC_abi_cxx11_._M_dataplus._M_p =
           (pointer)&GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTORCC_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTORCC_abi_cxx11_,
                 "AUTORCC","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTORCC_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTORCC_abi_cxx11_);
    }
  }
  if (genType - MOC < 3) {
    psVar2 = (string *)(&PTR_AUTOMOC_abi_cxx11__0067a4b0)[genType - MOC];
  }
  else {
    psVar2 = &GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOGEN_abi_cxx11_;
  }
  return psVar2;
}

Assistant:

std::string const& cmQtAutoGen::GeneratorNameUpper(GenT genType)
{
  static const std::string AUTOGEN("AUTOGEN");
  static const std::string AUTOMOC("AUTOMOC");
  static const std::string AUTOUIC("AUTOUIC");
  static const std::string AUTORCC("AUTORCC");

  switch (genType) {
    case GenT::GEN:
      return AUTOGEN;
    case GenT::MOC:
      return AUTOMOC;
    case GenT::UIC:
      return AUTOUIC;
    case GenT::RCC:
      return AUTORCC;
  }
  return AUTOGEN;
}